

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::CurrenciesTest_test_g10_currencies_are_valid_Test::
~CurrenciesTest_test_g10_currencies_are_valid_Test
          (CurrenciesTest_test_g10_currencies_are_valid_Test *this)

{
  CurrenciesTest_test_g10_currencies_are_valid_Test *this_local;
  
  ~CurrenciesTest_test_g10_currencies_are_valid_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CurrenciesTest, test_g10_currencies_are_valid)
{
    ASSERT_TRUE(Currencies::IsValidCurrency("USD"));
    ASSERT_TRUE(Currencies::IsValidCurrency("JPY"));
    ASSERT_TRUE(Currencies::IsValidCurrency("EUR"));
    ASSERT_TRUE(Currencies::IsValidCurrency("GBP"));
    ASSERT_TRUE(Currencies::IsValidCurrency("CHF"));
    ASSERT_TRUE(Currencies::IsValidCurrency("CAD"));
    ASSERT_TRUE(Currencies::IsValidCurrency("AUD"));
    ASSERT_TRUE(Currencies::IsValidCurrency("NZD"));
    ASSERT_TRUE(Currencies::IsValidCurrency("NOK"));
    ASSERT_TRUE(Currencies::IsValidCurrency("SEK"));
}